

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O2

shared_ptr<Buffer> __thiscall qpdf::Stream::getRawStreamData(Stream *this)

{
  qpdf_offset_t offset;
  bool bVar1;
  QPDFExc *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Stream *in_RSI;
  shared_ptr<Buffer> sVar2;
  allocator<char> local_ba;
  allocator<char> local_b9;
  string local_b8;
  string local_98;
  string local_78;
  Pl_Buffer buf;
  
  Pl_Buffer::Pl_Buffer(&buf,"stream data buffer",(Pipeline *)0x0);
  bVar1 = pipeStreamData(in_RSI,&buf.super_Pipeline,(bool *)0x0,0,qpdf_dl_none,false,false);
  if (bVar1) {
    Pl_Buffer::getBufferSharedPointer((Pl_Buffer *)this);
    Pl_Buffer::~Pl_Buffer(&buf);
    sVar2.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar2.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    return (shared_ptr<Buffer>)sVar2.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (QPDFExc *)__cxa_allocate_exception(0x80);
  QPDF::getFilename_abi_cxx11_
            (&local_78,
             ((in_RSI->super_BaseHandle).obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->qpdf);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_b9);
  offset = ((in_RSI->super_BaseHandle).obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->parsed_offset;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"error getting raw stream data",&local_ba);
  QPDFExc::QPDFExc(this_00,qpdf_e_unsupported,&local_78,&local_98,offset,&local_b8);
  __cxa_throw(this_00,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

std::shared_ptr<Buffer>
Stream::getRawStreamData()
{
    Pl_Buffer buf("stream data buffer");
    if (!pipeStreamData(&buf, nullptr, 0, qpdf_dl_none, false, false)) {
        throw QPDFExc(
            qpdf_e_unsupported,
            obj->getQPDF()->getFilename(),
            "",
            obj->getParsedOffset(),
            "error getting raw stream data");
    }
    QTC::TC("qpdf", "QPDF_Stream getRawStreamData");
    return buf.getBufferSharedPointer();
}